

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bessel.c
# Opt level: O1

double xc_bessel_I0_scaled(double x)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar2 = ABS(x);
  if (2.9802322387695312e-08 <= dVar2) {
    if (dVar2 <= 3.0) {
      dVar2 = exp(-dVar2);
      dVar4 = (x * x) / 4.5 + -1.0;
      uVar1 = 0xd;
      dVar3 = 0.0;
      dVar7 = 0.0;
      do {
        dVar5 = dVar7;
        dVar7 = dVar3;
        dVar3 = ((dVar4 + dVar4) * dVar7 - dVar5) + (double)(&DAT_010a7c70)[uVar1];
        uVar1 = uVar1 - 1;
      } while (1 < uVar1);
      dVar2 = dVar2 * ((dVar3 - dVar5) * 0.5 + 2.75);
    }
    else {
      if (dVar2 <= 8.0) {
        dVar4 = (48.0 / dVar2 + -11.0) / 5.0;
        uVar1 = 0x16;
        dVar3 = 0.0;
        dVar7 = 0.0;
        do {
          dVar5 = dVar3;
          dVar6 = ((dVar4 + dVar4) * dVar7 - dVar5) + bi0_data[uVar1 + 10];
          uVar1 = uVar1 - 1;
          dVar3 = dVar7;
          dVar7 = dVar6;
        } while (1 < uVar1);
      }
      else {
        dVar4 = 16.0 / dVar2 + -1.0;
        uVar1 = 0x17;
        dVar3 = 0.0;
        dVar7 = 0.0;
        do {
          dVar5 = dVar3;
          dVar6 = ((dVar4 + dVar4) * dVar7 - dVar5) + ai0_data[uVar1 + 0x14];
          uVar1 = uVar1 - 1;
          dVar3 = dVar7;
          dVar7 = dVar6;
        } while (1 < uVar1);
      }
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      dVar2 = ((dVar6 - dVar5) * 0.5 + 0.375) / dVar2;
    }
  }
  else {
    dVar2 = 1.0 - dVar2;
  }
  return dVar2;
}

Assistant:

GPU_FUNCTION
double xc_bessel_I0_scaled(const double x)
{
  double y = fabs(x), r = 0.0;

  if(y < 2.0*SQRT_DBL_EPSILON)
    r = 1.0 - y;
  else if(y <= 3.0)
    r = exp(-y)*(2.75 + xc_cheb_eval(y*y/4.5-1.0, bi0_data, 12));
  else if(y <= 8.0)
    r = (.375 + xc_cheb_eval((48.0/y - 11.0)/5.0, ai0_data, 21))/sqrt(y);
  else
    r = (.375 + xc_cheb_eval(16.0/y - 1.0, ai02_data, 22))/sqrt(y);

  return r;
}